

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBuilderUtil.cpp
# Opt level: O0

void __thiscall
vk::DescriptorSetUpdateBuilder::update
          (DescriptorSetUpdateBuilder *this,DeviceInterface *vk,VkDevice device)

{
  pointer pVVar1;
  bool bVar2;
  WriteDescriptorInfo *pWVar3;
  const_reference this_00;
  const_reference pvVar4;
  reference pvVar5;
  const_reference pvVar6;
  const_reference pvVar7;
  size_type sVar8;
  size_type sVar9;
  const_reference local_a0;
  reference local_98;
  VkCopyDescriptorSet *copyPtr;
  VkWriteDescriptorSet *writePtr;
  WriteDescriptorInfo *writeInfo;
  size_t writeNdx;
  vector<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_> writes;
  VkDevice device_local;
  DeviceInterface *vk_local;
  DescriptorSetUpdateBuilder *this_local;
  
  writes.super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)device;
  std::vector<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>::vector
            ((vector<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_> *)
             &writeNdx,&this->m_writes);
  writeInfo = (WriteDescriptorInfo *)0x0;
  while( true ) {
    pWVar3 = (WriteDescriptorInfo *)
             std::vector<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>::size
                       (&this->m_writes);
    if (pWVar3 <= writeInfo) break;
    this_00 = std::
              vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
              ::operator[](&this->m_writeDescriptorInfos,(size_type)writeInfo);
    bVar2 = std::vector<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>::
            empty(&this_00->imageInfos);
    if (!bVar2) {
      pvVar4 = std::vector<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>::
               operator[](&this_00->imageInfos,0);
      pvVar5 = std::vector<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>::
               operator[]((vector<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
                           *)&writeNdx,(size_type)writeInfo);
      pvVar5->pImageInfo = pvVar4;
    }
    bVar2 = std::vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>::
            empty(&this_00->bufferInfos);
    if (!bVar2) {
      pvVar6 = std::vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
               ::operator[](&this_00->bufferInfos,0);
      pvVar5 = std::vector<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>::
               operator[]((vector<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
                           *)&writeNdx,(size_type)writeInfo);
      pvVar5->pBufferInfo = pvVar6;
    }
    bVar2 = std::
            vector<vk::Handle<(vk::HandleType)12>,_std::allocator<vk::Handle<(vk::HandleType)12>_>_>
            ::empty(&this_00->texelBufferViews);
    if (!bVar2) {
      pvVar7 = std::
               vector<vk::Handle<(vk::HandleType)12>,_std::allocator<vk::Handle<(vk::HandleType)12>_>_>
               ::operator[](&this_00->texelBufferViews,0);
      pvVar5 = std::vector<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>::
               operator[]((vector<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
                           *)&writeNdx,(size_type)writeInfo);
      pvVar5->pTexelBufferView = pvVar7;
    }
    writeInfo = (WriteDescriptorInfo *)
                ((long)&(writeInfo->imageInfos).
                        super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start + 1);
  }
  bVar2 = std::vector<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>::empty
                    (&this->m_writes);
  if (bVar2) {
    local_98 = (reference)0x0;
  }
  else {
    local_98 = std::vector<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>::
               operator[]((vector<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
                           *)&writeNdx,0);
  }
  bVar2 = std::vector<vk::VkCopyDescriptorSet,_std::allocator<vk::VkCopyDescriptorSet>_>::empty
                    (&this->m_copies);
  if (bVar2) {
    local_a0 = (const_reference)0x0;
  }
  else {
    local_a0 = std::vector<vk::VkCopyDescriptorSet,_std::allocator<vk::VkCopyDescriptorSet>_>::
               operator[](&this->m_copies,0);
  }
  pVVar1 = writes.
           super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  sVar8 = std::vector<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>::size
                    ((vector<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_> *)
                     &writeNdx);
  sVar9 = std::vector<vk::VkCopyDescriptorSet,_std::allocator<vk::VkCopyDescriptorSet>_>::size
                    (&this->m_copies);
  (*vk->_vptr_DeviceInterface[0x3e])
            (vk,pVVar1,sVar8 & 0xffffffff,local_98,sVar9 & 0xffffffff,local_a0);
  std::vector<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>::~vector
            ((vector<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_> *)
             &writeNdx);
  return;
}

Assistant:

void DescriptorSetUpdateBuilder::update (const DeviceInterface& vk, VkDevice device) const
{
	// Update VkWriteDescriptorSet structures with stored info
	std::vector<VkWriteDescriptorSet> writes	= m_writes;

	for (size_t writeNdx = 0; writeNdx < m_writes.size(); writeNdx++)
	{
		const WriteDescriptorInfo& writeInfo = m_writeDescriptorInfos[writeNdx];

		if (!writeInfo.imageInfos.empty())
			writes[writeNdx].pImageInfo			= &writeInfo.imageInfos[0];

		if (!writeInfo.bufferInfos.empty())
			writes[writeNdx].pBufferInfo		= &writeInfo.bufferInfos[0];

		if (!writeInfo.texelBufferViews.empty())
			writes[writeNdx].pTexelBufferView	= &writeInfo.texelBufferViews[0];
	}

	const VkWriteDescriptorSet* const	writePtr	= (m_writes.empty()) ? (DE_NULL) : (&writes[0]);
	const VkCopyDescriptorSet* const	copyPtr		= (m_copies.empty()) ? (DE_NULL) : (&m_copies[0]);

	vk.updateDescriptorSets(device, (deUint32)writes.size(), writePtr, (deUint32)m_copies.size(), copyPtr);
}